

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

void __thiscall kj::String::~String(String *this)

{
  Array<char>::dispose(&this->content);
  return;
}

Assistant:

String() = default;